

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

bool __thiscall flatbuffers::cpp::CppGenerator::generate(CppGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  Namespace *name_space;
  pointer ppSVar3;
  StructDef *pSVar4;
  pointer ppEVar5;
  EnumDef *pEVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  long *plVar10;
  Parser *pPVar11;
  mapped_type *pmVar12;
  size_type *psVar13;
  pointer ppSVar14;
  char *pcVar15;
  CodeWriter *this_00;
  char *pcVar16;
  _Alloc_hider _Var17;
  pointer ppSVar18;
  StructDef **struct_def;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pointer ppEVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  string native_name;
  string file_path;
  string final_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string cpp_name;
  string include_guard;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  IDLOptions *local_c68;
  CodeWriter *local_c60;
  string local_c58;
  pointer local_c38;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  MarkIf64BitBuilderIsNeeded(this);
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  pcVar9 = BaseGenerator::FlatBuffersGeneratedWarning();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d08,pcVar9,(allocator<char> *)&local_ce8);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_d08,0,(char *)0x0,0x364e2f);
  psVar13 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_c88.field_2._M_allocated_capacity = *psVar13;
    local_c88.field_2._8_8_ = plVar10[3];
    local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  }
  else {
    local_c88.field_2._M_allocated_capacity = *psVar13;
    local_c88._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c88._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c88);
  psVar13 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_af0.field_2._M_allocated_capacity = *psVar13;
    local_af0.field_2._8_8_ = plVar10[3];
    local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  }
  else {
    local_af0.field_2._M_allocated_capacity = *psVar13;
    local_af0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_af0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_af0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p,local_c88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
    operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
  }
  psVar2 = (this->super_BaseGenerator).file_name_;
  name_space = ((this->super_BaseGenerator).parser_)->current_namespace_;
  local_d08._M_dataplus._M_p = (pointer)&local_d08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d08,"");
  GenIncludeGuard(&local_c88,(flatbuffers *)(psVar2->_M_dataplus)._M_p,
                  (string *)psVar2->_M_string_length,name_space,&local_d08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
    operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_50,"#ifndef ",&local_c88);
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_70,"#define ",&local_c88);
  CodeWriter::operator+=(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  CodeWriter::operator+=(this_00,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((this->opts_).super_IDLOptions.gen_nullable == true) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"#pragma clang system_header\n\n","");
    CodeWriter::operator+=(this_00,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"#include \"flatbuffers/flatbuffers.h\"","");
  CodeWriter::operator+=(this_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (((this->super_BaseGenerator).parser_)->uses_flexbuffers_ == true) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"#include \"flatbuffers/flexbuffers.h\"","");
    CodeWriter::operator+=(this_00,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"#include \"flatbuffers/flex_flat_util.h\"","");
    CodeWriter::operator+=(this_00,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  CodeWriter::operator+=(this_00,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  GenFlatbuffersVersionCheck(this);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  CodeWriter::operator+=(this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((this->opts_).super_IDLOptions.include_dependence_headers == true) {
    GenIncludeDependencies(this);
  }
  GenExtraIncludes(this);
  GenEmbeddedIncludes(this);
  if (this->cur_name_space_ == (Namespace *)0x0) {
    local_c68 = &(this->opts_).super_IDLOptions;
    pPVar11 = (this->super_BaseGenerator).parser_;
    ppSVar18 = (pPVar11->structs_).vec.
               super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_c38 = (pPVar11->structs_).vec.
                super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_c60 = this_00;
    if (ppSVar18 != local_c38) {
      do {
        paVar19 = &local_d08.field_2;
        if (((*ppSVar18)->super_Definition).generated == false) {
          SetNameSpace(this,((*ppSVar18)->super_Definition).defined_namespace);
          EscapeKeyword(&local_ce8,this,(string *)*ppSVar18);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_ce8,0,(char *)0x0,0x35ddd2);
          psVar13 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_d08.field_2._M_allocated_capacity = *psVar13;
            local_d08.field_2._8_8_ = plVar10[3];
            local_d08._M_dataplus._M_p = (pointer)paVar19;
          }
          else {
            local_d08.field_2._M_allocated_capacity = *psVar13;
            local_d08._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_d08._M_string_length = plVar10[1];
          *plVar10 = (long)psVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_d08);
          local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
          psVar13 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_bf0.field_2._M_allocated_capacity = *psVar13;
            local_bf0.field_2._8_8_ = plVar10[3];
          }
          else {
            local_bf0.field_2._M_allocated_capacity = *psVar13;
            local_bf0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_bf0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          CodeWriter::operator+=(this_00,&local_bf0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
            operator_delete(local_bf0._M_dataplus._M_p,local_bf0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d08._M_dataplus._M_p != paVar19) {
            operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
            operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1);
          }
          if ((*ppSVar18)->fixed == false) {
            EscapeKeyword(&local_ce8,this,(string *)*ppSVar18);
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_ce8,0,(char *)0x0,0x35ddd2);
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_d08.field_2._M_allocated_capacity = *psVar13;
              local_d08.field_2._8_8_ = plVar10[3];
              local_d08._M_dataplus._M_p = (pointer)paVar19;
            }
            else {
              local_d08.field_2._M_allocated_capacity = *psVar13;
              local_d08._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_d08._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_d08);
            local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_c10.field_2._M_allocated_capacity = *psVar13;
              local_c10.field_2._8_8_ = plVar10[3];
            }
            else {
              local_c10.field_2._M_allocated_capacity = *psVar13;
              local_c10._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_c10._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            CodeWriter::operator+=(this_00,&local_c10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
              operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d08._M_dataplus._M_p != paVar19) {
              operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
              operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
            EscapeKeyword(&local_ce8,this,(string *)*ppSVar18);
            NativeName(&local_d08,&local_ce8,*ppSVar18,local_c68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
              operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1
                             );
            }
            pPVar11 = (this->super_BaseGenerator).parser_;
            ppSVar3 = (pPVar11->structs_).vec.
                      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppSVar14 = (pPVar11->structs_).vec.
                            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; this_00 = local_c60,
                ppSVar14 != ppSVar3; ppSVar14 = ppSVar14 + 1) {
              pSVar4 = *ppSVar14;
              if ((pSVar4 != *ppSVar18) &&
                 ((pSVar4->super_Definition).defined_namespace ==
                  ((*ppSVar18)->super_Definition).defined_namespace)) {
                EscapeKeyword(&local_ce8,this,(string *)pSVar4);
                if ((local_d08._M_string_length == local_ce8._M_string_length) &&
                   ((local_d08._M_string_length == 0 ||
                    (iVar8 = bcmp(local_d08._M_dataplus._M_p,local_ce8._M_dataplus._M_p,
                                  local_d08._M_string_length), iVar8 == 0)))) {
                  EscapeKeyword(&local_c58,this,(string *)*ppSVar18);
                  plVar10 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_c58,0,(char *)0x0,0x35ddda);
                  local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
                  psVar13 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar13) {
                    local_cc8.field_2._M_allocated_capacity = *psVar13;
                    local_cc8.field_2._8_8_ = plVar10[3];
                  }
                  else {
                    local_cc8.field_2._M_allocated_capacity = *psVar13;
                    local_cc8._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_cc8._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar13;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_cc8);
                  local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
                  psVar13 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar13) {
                    local_d28.field_2._M_allocated_capacity = *psVar13;
                    local_d28.field_2._8_8_ = plVar10[3];
                  }
                  else {
                    local_d28.field_2._M_allocated_capacity = *psVar13;
                    local_d28._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_d28._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar13;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  plVar10 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&local_d28,(ulong)local_ce8._M_dataplus._M_p)
                  ;
                  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
                  psVar13 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar13) {
                    local_ca8.field_2._M_allocated_capacity = *psVar13;
                    local_ca8.field_2._8_8_ = plVar10[3];
                  }
                  else {
                    local_ca8.field_2._M_allocated_capacity = *psVar13;
                    local_ca8._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_ca8._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar13;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  LogCompilerError(&local_ca8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
                    operator_delete(local_ca8._M_dataplus._M_p,
                                    local_ca8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
                    operator_delete(local_d28._M_dataplus._M_p,
                                    local_d28.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
                    operator_delete(local_cc8._M_dataplus._M_p,
                                    local_cc8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
                    operator_delete(local_c58._M_dataplus._M_p,
                                    local_c58.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
                  operator_delete(local_ce8._M_dataplus._M_p,
                                  local_ce8.field_2._M_allocated_capacity + 1);
                }
              }
            }
            if ((*ppSVar18)->fixed == false) {
              std::operator+(&local_ce8,"struct ",&local_d08);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_ce8);
              local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_c30.field_2._M_allocated_capacity = *psVar13;
                local_c30.field_2._8_8_ = plVar10[3];
              }
              else {
                local_c30.field_2._M_allocated_capacity = *psVar13;
                local_c30._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_c30._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              CodeWriter::operator+=(this_00,&local_c30);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
                operator_delete(local_c30._M_dataplus._M_p,
                                local_c30.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
                operator_delete(local_ce8._M_dataplus._M_p,
                                local_ce8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
              operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"");
          CodeWriter::operator+=(this_00,&local_b90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
            operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
          }
        }
        ppSVar18 = ppSVar18 + 1;
      } while (ppSVar18 != local_c38);
    }
    if (((this->opts_).super_IDLOptions.generate_object_based_api != false) &&
       ((this->opts_).super_IDLOptions.gen_compare == true)) {
      pPVar11 = (this->super_BaseGenerator).parser_;
      ppSVar18 = (pPVar11->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar14 = (pPVar11->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar18 != ppSVar14) {
        local_c38 = ppSVar14;
        do {
          if (((*ppSVar18)->super_Definition).generated == false) {
            SetNameSpace(this,((*ppSVar18)->super_Definition).defined_namespace);
            EscapeKeyword(&local_ce8,this,(string *)*ppSVar18);
            NativeName(&local_d08,&local_ce8,*ppSVar18,local_c68);
            paVar19 = &local_ce8.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ce8._M_dataplus._M_p != paVar19) {
              operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_d28,"bool operator==(const ",&local_d08);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_d28);
            local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_ca8.field_2._M_allocated_capacity = *psVar13;
              local_ca8.field_2._8_8_ = plVar10[3];
            }
            else {
              local_ca8.field_2._M_allocated_capacity = *psVar13;
              local_ca8._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_ca8._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_ca8,(ulong)local_d08._M_dataplus._M_p);
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_ce8.field_2._M_allocated_capacity = *psVar13;
              local_ce8.field_2._8_8_ = plVar10[3];
              local_ce8._M_dataplus._M_p = (pointer)paVar19;
            }
            else {
              local_ce8.field_2._M_allocated_capacity = *psVar13;
              local_ce8._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_ce8._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_ce8);
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_bb0.field_2._M_allocated_capacity = *psVar13;
              local_bb0.field_2._8_8_ = plVar10[3];
              local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
            }
            else {
              local_bb0.field_2._M_allocated_capacity = *psVar13;
              local_bb0._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_bb0._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            CodeWriter::operator+=(local_c60,&local_bb0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
              operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ce8._M_dataplus._M_p != paVar19) {
              operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
              operator_delete(local_ca8._M_dataplus._M_p,local_ca8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
              operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_d28,"bool operator!=(const ",&local_d08);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_d28);
            local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_ca8.field_2._M_allocated_capacity = *psVar13;
              local_ca8.field_2._8_8_ = plVar10[3];
            }
            else {
              local_ca8.field_2._M_allocated_capacity = *psVar13;
              local_ca8._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_ca8._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_ca8,(ulong)local_d08._M_dataplus._M_p);
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_ce8.field_2._M_allocated_capacity = *psVar13;
              local_ce8.field_2._8_8_ = plVar10[3];
              local_ce8._M_dataplus._M_p = (pointer)paVar19;
            }
            else {
              local_ce8.field_2._M_allocated_capacity = *psVar13;
              local_ce8._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_ce8._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_ce8);
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_bd0.field_2._M_allocated_capacity = *psVar13;
              local_bd0.field_2._8_8_ = plVar10[3];
              local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
            }
            else {
              local_bd0.field_2._M_allocated_capacity = *psVar13;
              local_bd0._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_bd0._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            CodeWriter::operator+=(local_c60,&local_bd0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
              operator_delete(local_bd0._M_dataplus._M_p,local_bd0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ce8._M_dataplus._M_p != paVar19) {
              operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
              operator_delete(local_ca8._M_dataplus._M_p,local_ca8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
              operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1
                             );
            }
            ppSVar14 = local_c38;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
              operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1
                             );
              ppSVar14 = local_c38;
            }
          }
          ppSVar18 = ppSVar18 + 1;
        } while (ppSVar18 != ppSVar14);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      this_00 = local_c60;
      CodeWriter::operator+=(local_c60,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
    }
    pPVar11 = (this->super_BaseGenerator).parser_;
    if ((this->opts_).super_IDLOptions.mini_reflect != kNone) {
      ppSVar18 = (pPVar11->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar14 = (pPVar11->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar18 != ppSVar14) {
        do {
          if (((*ppSVar18)->super_Definition).generated == false) {
            SetNameSpace(this,((*ppSVar18)->super_Definition).defined_namespace);
            GenMiniReflectPre(this,*ppSVar18);
          }
          ppSVar18 = ppSVar18 + 1;
        } while (ppSVar18 != ppSVar14);
        pPVar11 = (this->super_BaseGenerator).parser_;
      }
    }
    ppEVar20 = (pPVar11->enums_).vec.
               super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppEVar5 = (pPVar11->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar20 != ppEVar5) {
      do {
        if (((*ppEVar20)->super_Definition).generated == false) {
          SetNameSpace(this,((*ppEVar20)->super_Definition).defined_namespace);
          GenEnum(this,*ppEVar20);
        }
        ppEVar20 = ppEVar20 + 1;
      } while (ppEVar20 != ppEVar5);
      pPVar11 = (this->super_BaseGenerator).parser_;
    }
    ppSVar18 = (pPVar11->structs_).vec.
               super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppSVar14 = (pPVar11->structs_).vec.
               super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar18 != ppSVar14) {
      do {
        pSVar4 = *ppSVar18;
        if ((pSVar4->fixed == true) && ((pSVar4->super_Definition).generated == false)) {
          SetNameSpace(this,(pSVar4->super_Definition).defined_namespace);
          GenStruct(this,*ppSVar18);
        }
        ppSVar18 = ppSVar18 + 1;
      } while (ppSVar18 != ppSVar14);
      pPVar11 = (this->super_BaseGenerator).parser_;
      ppSVar18 = (pPVar11->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar14 = (pPVar11->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar18 != ppSVar14) {
        do {
          pSVar4 = *ppSVar18;
          if ((pSVar4->fixed == false) && ((pSVar4->super_Definition).generated == false)) {
            SetNameSpace(this,(pSVar4->super_Definition).defined_namespace);
            GenTable(this,*ppSVar18);
          }
          ppSVar18 = ppSVar18 + 1;
        } while (ppSVar18 != ppSVar14);
        pPVar11 = (this->super_BaseGenerator).parser_;
        ppSVar18 = (pPVar11->structs_).vec.
                   super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppSVar14 = (pPVar11->structs_).vec.
                   super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (ppSVar18 != ppSVar14) {
        do {
          pSVar4 = *ppSVar18;
          if ((pSVar4->fixed == false) && ((pSVar4->super_Definition).generated == false)) {
            SetNameSpace(this,(pSVar4->super_Definition).defined_namespace);
            GenTablePost(this,*ppSVar18);
          }
          ppSVar18 = ppSVar18 + 1;
        } while (ppSVar18 != ppSVar14);
        pPVar11 = (this->super_BaseGenerator).parser_;
      }
    }
    ppEVar20 = (pPVar11->enums_).vec.
               super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppEVar5 = (pPVar11->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar20 != ppEVar5) {
      do {
        pEVar6 = *ppEVar20;
        if ((pEVar6->is_union == true) && ((pEVar6->super_Definition).generated == false)) {
          SetNameSpace(this,(pEVar6->super_Definition).defined_namespace);
          GenUnionPost(this,*ppEVar20);
        }
        ppEVar20 = ppEVar20 + 1;
      } while (ppEVar20 != ppEVar5);
      pPVar11 = (this->super_BaseGenerator).parser_;
    }
    if ((this->opts_).super_IDLOptions.mini_reflect != kNone) {
      ppEVar20 = (pPVar11->enums_).vec.
                 super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar5 = (pPVar11->enums_).vec.
                super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppEVar20 != ppEVar5) {
        do {
          if (((*ppEVar20)->super_Definition).generated == false) {
            SetNameSpace(this,((*ppEVar20)->super_Definition).defined_namespace);
            GenMiniReflect(this,(StructDef *)0x0,*ppEVar20);
          }
          ppEVar20 = ppEVar20 + 1;
        } while (ppEVar20 != ppEVar5);
        pPVar11 = (this->super_BaseGenerator).parser_;
      }
      ppSVar18 = (pPVar11->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar14 = (pPVar11->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar18 != ppSVar14) {
        do {
          if (((*ppSVar18)->super_Definition).generated == false) {
            SetNameSpace(this,((*ppSVar18)->super_Definition).defined_namespace);
            GenMiniReflect(this,*ppSVar18,(EnumDef *)0x0);
          }
          ppSVar18 = ppSVar18 + 1;
        } while (ppSVar18 != ppSVar14);
        pPVar11 = (this->super_BaseGenerator).parser_;
      }
    }
    pSVar4 = pPVar11->root_struct_def_;
    if (pSVar4 != (StructDef *)0x0) {
      SetNameSpace(this,(pSVar4->super_Definition).defined_namespace);
      EscapeKeyword(&local_d08,this,(string *)pSVar4);
      pcVar9 = "";
      Namespace::GetFullyQualifiedName(&local_ce8,this->cur_name_space_,&local_d08,1000);
      TranslateNameSpace(&local_ca8,&local_ce8);
      paVar19 = &local_d28.field_2;
      local_d28._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"STRUCT_NAME","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this_00->value_map_,&local_d28);
      std::__cxx11::string::_M_assign((string *)pmVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != paVar19) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
      local_d28._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"CPP_NAME","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this_00->value_map_,&local_d28);
      std::__cxx11::string::_M_assign((string *)pmVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != paVar19) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
      local_d28._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"NULLABLE_EXT","");
      bVar7 = (this->opts_).super_IDLOptions.gen_nullable;
      pcVar16 = " _Nullable ";
      if (bVar7 == false) {
        pcVar16 = "";
      }
      paVar1 = &local_cc8.field_2;
      pcVar15 = pcVar16 + 0xb;
      if (bVar7 == false) {
        pcVar15 = pcVar16;
      }
      local_cc8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,pcVar16,pcVar15);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this_00->value_map_,&local_d28);
      std::__cxx11::string::_M_assign((string *)pmVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc8._M_dataplus._M_p != paVar1) {
        operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != paVar19) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
      local_d28._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"SIZE_T","");
      if (this->needs_64_bit_builder_ != false) {
        pcVar9 = ",::flatbuffers::uoffset64_t";
      }
      pcVar16 = pcVar9 + 0x1b;
      if (this->needs_64_bit_builder_ == false) {
        pcVar16 = pcVar9;
      }
      local_cc8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,pcVar9,pcVar16);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this_00->value_map_,&local_d28);
      std::__cxx11::string::_M_assign((string *)pmVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc8._M_dataplus._M_p != paVar1) {
        operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != paVar19) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"inline \\","");
      CodeWriter::operator+=(this_00,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "const {{CPP_NAME}} *{{NULLABLE_EXT}}Get{{STRUCT_NAME}}(const void *buf) {","");
      CodeWriter::operator+=(this_00,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,"  return ::flatbuffers::GetRoot<{{CPP_NAME}}>(buf);","");
      CodeWriter::operator+=(this_00,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"}","");
      CodeWriter::operator+=(this_00,&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
      CodeWriter::operator+=(this_00,&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"inline \\","");
      CodeWriter::operator+=(this_00,&local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,
                 "const {{CPP_NAME}} *{{NULLABLE_EXT}}GetSizePrefixed{{STRUCT_NAME}}(const void *buf) {"
                 ,"");
      CodeWriter::operator+=(this_00,&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_310,
                 "  return ::flatbuffers::GetSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);","");
      CodeWriter::operator+=(this_00,&local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"}","");
      CodeWriter::operator+=(this_00,&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"");
      CodeWriter::operator+=(this_00,&local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if ((this->opts_).super_IDLOptions.mutable_buffer == true) {
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"inline \\","");
        CodeWriter::operator+=(this_00,&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_390,"{{STRUCT_NAME}} *GetMutable{{STRUCT_NAME}}(void *buf) {",""
                  );
        CodeWriter::operator+=(this_00,&local_390);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3b0,
                   "  return ::flatbuffers::GetMutableRoot<{{STRUCT_NAME}}>(buf);","");
        CodeWriter::operator+=(this_00,&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
        }
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"}","");
        CodeWriter::operator+=(this_00,&local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"");
        CodeWriter::operator+=(this_00,&local_3f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
        }
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"inline \\","");
        CodeWriter::operator+=(this_00,&local_410);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_430,
                   "{{CPP_NAME}} *{{NULLABLE_EXT}}GetMutableSizePrefixed{{STRUCT_NAME}}(void *buf) {"
                   ,"");
        CodeWriter::operator+=(this_00,&local_430);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_450,
                   "  return ::flatbuffers::GetMutableSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);"
                   ,"");
        CodeWriter::operator+=(this_00,&local_450);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"}","");
        CodeWriter::operator+=(this_00,&local_470);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
        }
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
        CodeWriter::operator+=(this_00,&local_490);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
      }
      if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length != 0) {
        local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4b0,"inline const char *{{STRUCT_NAME}}Identifier() {","");
        CodeWriter::operator+=(this_00,&local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_d28,"  return \"",
                       &((this->super_BaseGenerator).parser_)->file_identifier_);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_d28);
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_b10.field_2._M_allocated_capacity = *psVar13;
          local_b10.field_2._8_8_ = plVar10[3];
          local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
        }
        else {
          local_b10.field_2._M_allocated_capacity = *psVar13;
          local_b10._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_b10._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        CodeWriter::operator+=(this_00,&local_b10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
          operator_delete(local_b10._M_dataplus._M_p,local_b10.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d28._M_dataplus._M_p != paVar19) {
          operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
        }
        local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"}","");
        CodeWriter::operator+=(this_00,&local_4d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"");
        CodeWriter::operator+=(this_00,&local_4f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"inline \\","");
        CodeWriter::operator+=(this_00,&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_530,"bool {{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {"
                   ,"");
        CodeWriter::operator+=(this_00,&local_530);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_550,"  return ::flatbuffers::BufferHasIdentifier(","");
        CodeWriter::operator+=(this_00,&local_550);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_570,"      buf, {{STRUCT_NAME}}Identifier());","");
        CodeWriter::operator+=(this_00,&local_570);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"}","");
        CodeWriter::operator+=(this_00,&local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"");
        CodeWriter::operator+=(this_00,&local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
        local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"inline \\","");
        CodeWriter::operator+=(this_00,&local_5d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5f0,
                   "bool SizePrefixed{{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {","");
        CodeWriter::operator+=(this_00,&local_5f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
          operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
        }
        local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_610,"  return ::flatbuffers::BufferHasIdentifier(","");
        CodeWriter::operator+=(this_00,&local_610);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._M_dataplus._M_p != &local_610.field_2) {
          operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
        }
        local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_630,"      buf, {{STRUCT_NAME}}Identifier(), true);","");
        CodeWriter::operator+=(this_00,&local_630);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        }
        local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"}","");
        CodeWriter::operator+=(this_00,&local_650);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_650._M_dataplus._M_p != &local_650.field_2) {
          operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
        }
        local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"");
        CodeWriter::operator+=(this_00,&local_670);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_670._M_dataplus._M_p != &local_670.field_2) {
          operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
        }
      }
      if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
        local_d28._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"ID","");
        local_cc8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"nullptr","");
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this_00->value_map_,&local_d28);
        std::__cxx11::string::_M_assign((string *)pmVar12);
      }
      else {
        local_d28._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"ID","");
        local_cc8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_cc8,local_d08._M_dataplus._M_p,
                   local_d08._M_dataplus._M_p + local_d08._M_string_length);
        std::__cxx11::string::append((char *)&local_cc8);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this_00->value_map_,&local_d28);
        std::__cxx11::string::_M_assign((string *)pmVar12);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc8._M_dataplus._M_p != paVar1) {
        operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != paVar19) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
      local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_690,"inline bool Verify{{STRUCT_NAME}}Buffer(","");
      CodeWriter::operator+=(this_00,&local_690);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690._M_dataplus._M_p != &local_690.field_2) {
        operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
      }
      local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6b0,"    ::flatbuffers::Verifier &verifier) {","");
      CodeWriter::operator+=(this_00,&local_6b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
        operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
      }
      local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d0,"  return verifier.VerifyBuffer<{{CPP_NAME}}>({{ID}});","");
      CodeWriter::operator+=(this_00,&local_6d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
        operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
      }
      local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"}","");
      CodeWriter::operator+=(this_00,&local_6f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
        operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
      }
      local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"");
      CodeWriter::operator+=(this_00,&local_710);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_710._M_dataplus._M_p != &local_710.field_2) {
        operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
      }
      local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_730,"inline bool VerifySizePrefixed{{STRUCT_NAME}}Buffer(","");
      CodeWriter::operator+=(this_00,&local_730);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_730._M_dataplus._M_p != &local_730.field_2) {
        operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
      }
      local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_750,"    ::flatbuffers::Verifier &verifier) {","");
      CodeWriter::operator+=(this_00,&local_750);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_750._M_dataplus._M_p != &local_750.field_2) {
        operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
      }
      local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_770,
                 "  return verifier.VerifySizePrefixedBuffer<{{CPP_NAME}}{{SIZE_T}}>({{ID}});","");
      CodeWriter::operator+=(this_00,&local_770);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"}","");
      CodeWriter::operator+=(this_00,&local_790);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_790._M_dataplus._M_p != &local_790.field_2) {
        operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
      }
      local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"");
      CodeWriter::operator+=(this_00,&local_7b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
      }
      if ((((this->super_BaseGenerator).parser_)->file_extension_)._M_string_length != 0) {
        local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7d0,"inline const char *{{STRUCT_NAME}}Extension() {","");
        CodeWriter::operator+=(this_00,&local_7d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
          operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_d28,"  return \"",
                       &((this->super_BaseGenerator).parser_)->file_extension_);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_d28);
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_b30.field_2._M_allocated_capacity = *psVar13;
          local_b30.field_2._8_8_ = plVar10[3];
          local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
        }
        else {
          local_b30.field_2._M_allocated_capacity = *psVar13;
          local_b30._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_b30._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        CodeWriter::operator+=(this_00,&local_b30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
          operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d28._M_dataplus._M_p != paVar19) {
          operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
        }
        local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"}","");
        CodeWriter::operator+=(this_00,&local_7f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
        }
        local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"");
        CodeWriter::operator+=(this_00,&local_810);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_dataplus._M_p != &local_810.field_2) {
          operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
        }
      }
      local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_830,"inline void Finish{{STRUCT_NAME}}Buffer(","");
      CodeWriter::operator+=(this_00,&local_830);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830._M_dataplus._M_p != &local_830.field_2) {
        operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
      }
      GetBuilder_abi_cxx11_(&local_cc8,this);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_cc8,0,(char *)0x0,0x366c87);
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_d28.field_2._M_allocated_capacity = *psVar13;
        local_d28.field_2._8_8_ = plVar10[3];
        local_d28._M_dataplus._M_p = (pointer)paVar19;
      }
      else {
        local_d28.field_2._M_allocated_capacity = *psVar13;
        local_d28._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_d28._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_d28);
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_b50.field_2._M_allocated_capacity = *psVar13;
        local_b50.field_2._8_8_ = plVar10[3];
        local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      }
      else {
        local_b50.field_2._M_allocated_capacity = *psVar13;
        local_b50._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_b50._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      CodeWriter::operator+=(this_00,&local_b50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,local_b50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != paVar19) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc8._M_dataplus._M_p != paVar1) {
        operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
      }
      local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_850,"    ::flatbuffers::Offset<{{CPP_NAME}}> root) {","");
      CodeWriter::operator+=(this_00,&local_850);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850._M_dataplus._M_p != &local_850.field_2) {
        operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
      }
      if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
        paVar21 = &local_b0.field_2;
        local_b0._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"  fbb.Finish(root);","");
        CodeWriter::operator+=(this_00,&local_b0);
        _Var17._M_p = local_b0._M_dataplus._M_p;
      }
      else {
        paVar21 = &local_90.field_2;
        local_90._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"  fbb.Finish(root, {{STRUCT_NAME}}Identifier());","");
        CodeWriter::operator+=(this_00,&local_90);
        _Var17._M_p = local_90._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != paVar21) {
        operator_delete(_Var17._M_p,paVar21->_M_allocated_capacity + 1);
      }
      local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"}","");
      CodeWriter::operator+=(this_00,&local_870);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_870._M_dataplus._M_p != &local_870.field_2) {
        operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
      }
      local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"");
      CodeWriter::operator+=(this_00,&local_890);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890._M_dataplus._M_p != &local_890.field_2) {
        operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
      }
      local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_8b0,"inline void FinishSizePrefixed{{STRUCT_NAME}}Buffer(","");
      CodeWriter::operator+=(this_00,&local_8b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
        operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
      }
      GetBuilder_abi_cxx11_(&local_cc8,this);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_cc8,0,(char *)0x0,0x366c87);
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_d28.field_2._M_allocated_capacity = *psVar13;
        local_d28.field_2._8_8_ = plVar10[3];
        local_d28._M_dataplus._M_p = (pointer)paVar19;
      }
      else {
        local_d28.field_2._M_allocated_capacity = *psVar13;
        local_d28._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_d28._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_d28);
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_b70.field_2._M_allocated_capacity = *psVar13;
        local_b70.field_2._8_8_ = plVar10[3];
        local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      }
      else {
        local_b70.field_2._M_allocated_capacity = *psVar13;
        local_b70._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_b70._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      CodeWriter::operator+=(this_00,&local_b70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,local_b70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != paVar19) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc8._M_dataplus._M_p != paVar1) {
        operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
      }
      local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_8d0,"    ::flatbuffers::Offset<{{CPP_NAME}}> root) {","");
      CodeWriter::operator+=(this_00,&local_8d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
        operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
      }
      if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
        paVar21 = &local_f0.field_2;
        local_f0._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"  fbb.FinishSizePrefixed(root);","");
        CodeWriter::operator+=(this_00,&local_f0);
        _Var17._M_p = local_f0._M_dataplus._M_p;
      }
      else {
        paVar21 = &local_d0.field_2;
        local_d0._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "  fbb.FinishSizePrefixed(root, {{STRUCT_NAME}}Identifier());","");
        CodeWriter::operator+=(this_00,&local_d0);
        _Var17._M_p = local_d0._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != paVar21) {
        operator_delete(_Var17._M_p,paVar21->_M_allocated_capacity + 1);
      }
      local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"}","");
      CodeWriter::operator+=(this_00,&local_8f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
        operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
      }
      local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"");
      CodeWriter::operator+=(this_00,&local_910);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_910._M_dataplus._M_p != &local_910.field_2) {
        operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
      }
      if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
        WrapNativeNameInNameSpace_abi_cxx11_(&local_d28,this,pSVar4,local_c68);
        local_cc8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"UNPACK_RETURN","");
        GenTypeNativePtr(&local_c58,this,&local_d28,(FieldDef *)0x0,false);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this_00->value_map_,&local_cc8);
        std::__cxx11::string::_M_assign((string *)pmVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
          operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cc8._M_dataplus._M_p != paVar1) {
          operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
        }
        local_cc8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"UNPACK_TYPE","");
        GenTypeNativePtr(&local_c58,this,&local_d28,(FieldDef *)0x0,true);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this_00->value_map_,&local_cc8);
        std::__cxx11::string::_M_assign((string *)pmVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
          operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cc8._M_dataplus._M_p != paVar1) {
          operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
        }
        local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_930,"inline {{UNPACK_RETURN}} UnPack{{STRUCT_NAME}}(","");
        CodeWriter::operator+=(this_00,&local_930);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_930._M_dataplus._M_p != &local_930.field_2) {
          operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
        }
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_950,"    const void *buf,","");
        CodeWriter::operator+=(this_00,&local_950);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
        }
        local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_970,
                   "    const ::flatbuffers::resolver_function_t *res = nullptr) {","");
        CodeWriter::operator+=(this_00,&local_970);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_970._M_dataplus._M_p != &local_970.field_2) {
          operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
        }
        local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_990,"  return {{UNPACK_TYPE}}\\","");
        CodeWriter::operator+=(this_00,&local_990);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_990._M_dataplus._M_p != &local_990.field_2) {
          operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
        }
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_9b0,"(Get{{STRUCT_NAME}}(buf)->UnPack(res));","");
        CodeWriter::operator+=(this_00,&local_9b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
        }
        local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"}","");
        CodeWriter::operator+=(this_00,&local_9d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
          operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
        }
        local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,"");
        CodeWriter::operator+=(this_00,&local_9f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
          operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
        }
        local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a10,
                   "inline {{UNPACK_RETURN}} UnPackSizePrefixed{{STRUCT_NAME}}(","");
        CodeWriter::operator+=(this_00,&local_a10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
          operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
        }
        local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a30,"    const void *buf,","");
        CodeWriter::operator+=(this_00,&local_a30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
          operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
        }
        local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a50,
                   "    const ::flatbuffers::resolver_function_t *res = nullptr) {","");
        CodeWriter::operator+=(this_00,&local_a50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
          operator_delete(local_a50._M_dataplus._M_p,local_a50.field_2._M_allocated_capacity + 1);
        }
        local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a70,"  return {{UNPACK_TYPE}}\\","");
        CodeWriter::operator+=(this_00,&local_a70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
          operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
        }
        local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a90,"(GetSizePrefixed{{STRUCT_NAME}}(buf)->UnPack(res));","");
        CodeWriter::operator+=(this_00,&local_a90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
          operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
        }
        local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"}","");
        CodeWriter::operator+=(this_00,&local_ab0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
          operator_delete(local_ab0._M_dataplus._M_p,local_ab0.field_2._M_allocated_capacity + 1);
        }
        local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"");
        CodeWriter::operator+=(this_00,&local_ad0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
          operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d28._M_dataplus._M_p != paVar19) {
          operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
        operator_delete(local_ca8._M_dataplus._M_p,local_ca8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
        operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
        operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->cur_name_space_ != (Namespace *)0x0) {
      SetNameSpace(this,(Namespace *)0x0);
    }
    std::operator+(&local_110,"#endif  // ",&local_c88);
    CodeWriter::operator+=(this_00,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    BaseGenerator::GeneratedFileName
              (&local_d08,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
               (this->super_BaseGenerator).file_name_,local_c68);
    std::__cxx11::stringbuf::str();
    bVar7 = SaveFile(local_d08._M_dataplus._M_p,local_ce8._M_dataplus._M_p,
                     local_ce8._M_string_length,false);
    if (bVar7) {
      bVar7 = true;
      if ((((this->super_BaseGenerator).parser_)->opts).binary_schema_gen_embed == true) {
        bVar7 = generate_bfbs_embed(this);
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
      operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
      operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
      operator_delete(local_c88._M_dataplus._M_p,local_c88.field_2._M_allocated_capacity + 1);
    }
    return bVar7;
  }
  __assert_fail("!cur_name_space_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                ,0x1c9,"virtual bool flatbuffers::cpp::CppGenerator::generate()");
}

Assistant:

bool generate() {
    // Check if we require a 64-bit flatbuffer builder.
    MarkIf64BitBuilderIsNeeded();

    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";

    const auto include_guard =
        GenIncludeGuard(file_name_, *parser_.current_namespace_);
    code_ += "#ifndef " + include_guard;
    code_ += "#define " + include_guard;
    code_ += "";

    if (opts_.gen_nullable) { code_ += "#pragma clang system_header\n\n"; }

    code_ += "#include \"flatbuffers/flatbuffers.h\"";
    if (parser_.uses_flexbuffers_) {
      code_ += "#include \"flatbuffers/flexbuffers.h\"";
      code_ += "#include \"flatbuffers/flex_flat_util.h\"";
    }
    code_ += "";
    GenFlatbuffersVersionCheck();
    code_ += "";

    if (opts_.include_dependence_headers) { GenIncludeDependencies(); }
    GenExtraIncludes();
    GenEmbeddedIncludes();

    FLATBUFFERS_ASSERT(!cur_name_space_);

    // Generate forward declarations for all structs/tables, since they may
    // have circular references.
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        code_ += "struct " + Name(*struct_def) + ";";
        if (!struct_def->fixed) {
          code_ += "struct " + Name(*struct_def) + "Builder;";
        }
        if (opts_.generate_object_based_api) {
          auto nativeName = NativeName(Name(*struct_def), struct_def, opts_);

          // Check that nativeName doesn't collide the name of another struct.
          for (const auto &other_struct_def : parser_.structs_.vec) {
            if (other_struct_def == struct_def ||
                other_struct_def->defined_namespace !=
                    struct_def->defined_namespace) {
              continue;
            }

            auto other_name = Name(*other_struct_def);
            if (nativeName == other_name) {
              LogCompilerError("Generated Object API type for " +
                               Name(*struct_def) + " collides with " +
                               other_name);
              FLATBUFFERS_ASSERT(true);
            }
          }

          if (!struct_def->fixed) { code_ += "struct " + nativeName + ";"; }
        }
        code_ += "";
      }
    }

    // Generate forward declarations for all equal operators
    if (opts_.generate_object_based_api && opts_.gen_compare) {
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          auto nativeName = NativeName(Name(*struct_def), struct_def, opts_);
          code_ += "bool operator==(const " + nativeName + " &lhs, const " +
                   nativeName + " &rhs);";
          code_ += "bool operator!=(const " + nativeName + " &lhs, const " +
                   nativeName + " &rhs);";
        }
      }
      code_ += "";
    }

    // Generate preablmle code for mini reflection.
    if (opts_.mini_reflect != IDLOptions::kNone) {
      // To break cyclic dependencies, first pre-declare all tables/structs.
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          GenMiniReflectPre(struct_def);
        }
      }
    }

    // Generate code for all the enum declarations.
    for (const auto &enum_def : parser_.enums_.vec) {
      if (!enum_def->generated) {
        SetNameSpace(enum_def->defined_namespace);
        GenEnum(*enum_def);
      }
    }

    // Generate code for all structs, then all tables.
    for (const auto &struct_def : parser_.structs_.vec) {
      if (struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenStruct(*struct_def);
      }
    }
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenTable(*struct_def);
      }
    }
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenTablePost(*struct_def);
      }
    }

    // Generate code for union verifiers.
    for (const auto &enum_def : parser_.enums_.vec) {
      if (enum_def->is_union && !enum_def->generated) {
        SetNameSpace(enum_def->defined_namespace);
        GenUnionPost(*enum_def);
      }
    }

    // Generate code for mini reflection.
    if (opts_.mini_reflect != IDLOptions::kNone) {
      // Then the unions/enums that may refer to them.
      for (const auto &enum_def : parser_.enums_.vec) {
        if (!enum_def->generated) {
          SetNameSpace(enum_def->defined_namespace);
          GenMiniReflect(nullptr, enum_def);
        }
      }
      // Then the full tables/structs.
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          GenMiniReflect(struct_def, nullptr);
        }
      }
    }

    // Generate convenient global helper functions:
    if (parser_.root_struct_def_) {
      auto &struct_def = *parser_.root_struct_def_;
      SetNameSpace(struct_def.defined_namespace);
      auto name = Name(struct_def);
      auto qualified_name = cur_name_space_->GetFullyQualifiedName(name);
      auto cpp_name = TranslateNameSpace(qualified_name);

      code_.SetValue("STRUCT_NAME", name);
      code_.SetValue("CPP_NAME", cpp_name);
      code_.SetValue("NULLABLE_EXT", NullableExtension());
      code_.SetValue(
          "SIZE_T", needs_64_bit_builder_ ? ",::flatbuffers::uoffset64_t" : "");

      // The root datatype accessor:
      code_ += "inline \\";
      code_ +=
          "const {{CPP_NAME}} *{{NULLABLE_EXT}}Get{{STRUCT_NAME}}(const void "
          "*buf) {";
      code_ += "  return ::flatbuffers::GetRoot<{{CPP_NAME}}>(buf);";
      code_ += "}";
      code_ += "";

      code_ += "inline \\";
      code_ +=
          "const {{CPP_NAME}} "
          "*{{NULLABLE_EXT}}GetSizePrefixed{{STRUCT_NAME}}(const void "
          "*buf) {";
      code_ +=
          "  return "
          "::flatbuffers::GetSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);";
      code_ += "}";
      code_ += "";

      if (opts_.mutable_buffer) {
        code_ += "inline \\";
        code_ += "{{STRUCT_NAME}} *GetMutable{{STRUCT_NAME}}(void *buf) {";
        code_ +=
            "  return ::flatbuffers::GetMutableRoot<{{STRUCT_NAME}}>(buf);";
        code_ += "}";
        code_ += "";

        code_ += "inline \\";
        code_ +=
            "{{CPP_NAME}} "
            "*{{NULLABLE_EXT}}GetMutableSizePrefixed{{STRUCT_NAME}}(void "
            "*buf) {";
        code_ +=
            "  return "
            "::flatbuffers::GetMutableSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>("
            "buf);";
        code_ += "}";
        code_ += "";
      }

      if (parser_.file_identifier_.length()) {
        // Return the identifier
        code_ += "inline const char *{{STRUCT_NAME}}Identifier() {";
        code_ += "  return \"" + parser_.file_identifier_ + "\";";
        code_ += "}";
        code_ += "";

        // Check if a buffer has the identifier.
        code_ += "inline \\";
        code_ += "bool {{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {";
        code_ += "  return ::flatbuffers::BufferHasIdentifier(";
        code_ += "      buf, {{STRUCT_NAME}}Identifier());";
        code_ += "}";
        code_ += "";

        // Check if a size-prefixed buffer has the identifier.
        code_ += "inline \\";
        code_ +=
            "bool SizePrefixed{{STRUCT_NAME}}BufferHasIdentifier(const void "
            "*buf) {";
        code_ += "  return ::flatbuffers::BufferHasIdentifier(";
        code_ += "      buf, {{STRUCT_NAME}}Identifier(), true);";
        code_ += "}";
        code_ += "";
      }

      // The root verifier.
      if (parser_.file_identifier_.length()) {
        code_.SetValue("ID", name + "Identifier()");
      } else {
        code_.SetValue("ID", "nullptr");
      }

      code_ += "inline bool Verify{{STRUCT_NAME}}Buffer(";
      code_ += "    ::flatbuffers::Verifier &verifier) {";
      code_ += "  return verifier.VerifyBuffer<{{CPP_NAME}}>({{ID}});";
      code_ += "}";
      code_ += "";

      code_ += "inline bool VerifySizePrefixed{{STRUCT_NAME}}Buffer(";
      code_ += "    ::flatbuffers::Verifier &verifier) {";
      code_ +=
          "  return "
          "verifier.VerifySizePrefixedBuffer<{{CPP_NAME}}{{SIZE_T}}>({{ID}});";
      code_ += "}";
      code_ += "";

      if (parser_.file_extension_.length()) {
        // Return the extension
        code_ += "inline const char *{{STRUCT_NAME}}Extension() {";
        code_ += "  return \"" + parser_.file_extension_ + "\";";
        code_ += "}";
        code_ += "";
      }

      // Finish a buffer with a given root object:
      code_ += "inline void Finish{{STRUCT_NAME}}Buffer(";
      code_ += "    " + GetBuilder() + " &fbb,";
      code_ += "    ::flatbuffers::Offset<{{CPP_NAME}}> root) {";
      if (parser_.file_identifier_.length())
        code_ += "  fbb.Finish(root, {{STRUCT_NAME}}Identifier());";
      else
        code_ += "  fbb.Finish(root);";
      code_ += "}";
      code_ += "";

      code_ += "inline void FinishSizePrefixed{{STRUCT_NAME}}Buffer(";
      code_ += "    " + GetBuilder() + " &fbb,";
      code_ += "    ::flatbuffers::Offset<{{CPP_NAME}}> root) {";
      if (parser_.file_identifier_.length())
        code_ += "  fbb.FinishSizePrefixed(root, {{STRUCT_NAME}}Identifier());";
      else
        code_ += "  fbb.FinishSizePrefixed(root);";
      code_ += "}";
      code_ += "";

      if (opts_.generate_object_based_api) {
        // A convenient root unpack function.
        auto native_name = WrapNativeNameInNameSpace(struct_def, opts_);
        code_.SetValue("UNPACK_RETURN",
                       GenTypeNativePtr(native_name, nullptr, false));
        code_.SetValue("UNPACK_TYPE",
                       GenTypeNativePtr(native_name, nullptr, true));

        code_ += "inline {{UNPACK_RETURN}} UnPack{{STRUCT_NAME}}(";
        code_ += "    const void *buf,";
        code_ +=
            "    const ::flatbuffers::resolver_function_t *res = nullptr) {";
        code_ += "  return {{UNPACK_TYPE}}\\";
        code_ += "(Get{{STRUCT_NAME}}(buf)->UnPack(res));";
        code_ += "}";
        code_ += "";

        code_ += "inline {{UNPACK_RETURN}} UnPackSizePrefixed{{STRUCT_NAME}}(";
        code_ += "    const void *buf,";
        code_ +=
            "    const ::flatbuffers::resolver_function_t *res = nullptr) {";
        code_ += "  return {{UNPACK_TYPE}}\\";
        code_ += "(GetSizePrefixed{{STRUCT_NAME}}(buf)->UnPack(res));";
        code_ += "}";
        code_ += "";
      }
    }

    if (cur_name_space_) SetNameSpace(nullptr);

    // Close the include guard.
    code_ += "#endif  // " + include_guard;

    const auto file_path = GeneratedFileName(path_, file_name_, opts_);
    const auto final_code = code_.ToString();

    // Save the file and optionally generate the binary schema code.
    return SaveFile(file_path.c_str(), final_code, false) &&
           (!parser_.opts.binary_schema_gen_embed || generate_bfbs_embed());
  }